

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::string_t,_double> *source,
               ArgMinMaxState<duckdb::string_t,_double> *target,AggregateInputData *param_3)

{
  bool bVar1;
  double *in_RDX;
  double *in_RSI;
  byte *in_RDI;
  
  if (((*in_RDI & 1) != 0) &&
     ((((ulong)*in_RSI & 1) == 0 || (bVar1 = LessThan::Operation<double>(in_RSI,in_RDX), bVar1)))) {
    Assign<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
              (source,(string_t *)target,(double *)param_3,SUB81((ulong)in_RDI >> 0x38,0));
    *(undefined1 *)in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}